

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MahjongGB.cpp
# Opt level: O3

vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* MahjongFanCalculator
            (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            *pack,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *hand,string *winTile,int flowerCount,bool isZIMO,bool isJUEZHANG,bool isGANG,
            bool isLAST,int menFeng,int quanFeng)

{
  pointer pbVar1;
  pointer ppVar2;
  undefined2 uVar3;
  undefined8 uVar4;
  int iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  pointer ppVar8;
  byte *pbVar9;
  string *psVar10;
  ushort uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  pointer pbVar16;
  undefined3 in_register_00000089;
  int *piVar17;
  bool bVar18;
  fan_table_t fan_table;
  allocator local_161;
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
  *local_160;
  int local_158;
  undefined4 local_154;
  string *local_150;
  calculate_param_t local_148;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  uint16_t local_d8 [84];
  
  local_154 = CONCAT31(in_register_00000089,isZIMO);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.hand_tiles.fixed_packs[0] = 0;
  local_148.hand_tiles.fixed_packs[1] = 0;
  local_148.hand_tiles.fixed_packs[2] = 0;
  local_148.hand_tiles.fixed_packs[3] = 0;
  local_148.hand_tiles.fixed_packs[4] = 0;
  local_148.hand_tiles._10_6_ = 0;
  local_148.hand_tiles.pack_count = 0;
  local_148.hand_tiles.standing_tiles[0] = '\0';
  local_148.hand_tiles.standing_tiles[1] = '\0';
  local_148.hand_tiles.standing_tiles[2] = '\0';
  local_148.hand_tiles.standing_tiles[3] = '\0';
  local_148.hand_tiles.standing_tiles[4] = '\0';
  local_148.hand_tiles.standing_tiles[5] = '\0';
  local_148.hand_tiles.standing_tiles[6] = '\0';
  local_148.hand_tiles.standing_tiles[7] = '\0';
  local_148.hand_tiles.standing_tiles[8] = '\0';
  local_148.hand_tiles.standing_tiles[9] = '\0';
  local_148.hand_tiles.standing_tiles[10] = '\0';
  local_148.hand_tiles.standing_tiles[0xb] = '\0';
  local_148.hand_tiles.standing_tiles[0xc] = '\0';
  local_148.hand_tiles._37_3_ = 0;
  local_148.hand_tiles.tile_count = 0;
  local_148.win_tile = '\0';
  local_148.flower_count = '\0';
  local_148.win_flag = '\0';
  local_148._51_1_ = 0;
  local_148.prevalent_wind = EAST;
  local_148.seat_wind = EAST;
  local_148._60_4_ = 0;
  local_160 = (vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  local_158 = flowerCount;
  local_150 = winTile;
  memset(local_d8,0,0xa6);
  pbVar16 = (hand->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (hand->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_148.hand_tiles.tile_count = (long)pbVar1 - (long)pbVar16 >> 5;
  if (pbVar1 != pbVar16) {
    uVar12 = 1;
    uVar14 = 0;
    do {
      uVar13 = uVar12;
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&str2tile_abi_cxx11_._M_h,pbVar16 + uVar14);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
          ._M_cur == (__node_type *)0x0) {
        psVar10 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar10 = psVar10 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>(psVar10,"ERROE_WRONG_TILE_CODE","");
        __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&str2tile_abi_cxx11_,
                            (hand->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar14);
      local_148.hand_tiles.standing_tiles[uVar14] = *pmVar7;
      pbVar16 = (hand->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ulong)((int)uVar13 + 1);
      uVar14 = uVar13;
    } while (uVar13 < (ulong)((long)(hand->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16 >> 5
                             ));
  }
  ppVar8 = (pack->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (pack->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_148.hand_tiles.pack_count = ((long)ppVar2 - (long)ppVar8 >> 3) * -0x71c71c71c71c71c7;
  if (ppVar2 != ppVar8) {
    uVar12 = 0;
    uVar14 = 1;
    do {
      ppVar8 = ppVar8 + uVar12;
      iVar5 = std::__cxx11::string::compare((char *)ppVar8);
      if (iVar5 == 0) {
        iVar5 = (ppVar8->second).second;
        pbVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&str2tile_abi_cxx11_,&(ppVar8->second).first);
        uVar11 = 0x200;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)ppVar8);
        if (iVar5 == 0) {
          iVar5 = (ppVar8->second).second;
          pbVar9 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&str2tile_abi_cxx11_,&(ppVar8->second).first);
          uVar11 = 0x300;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)ppVar8);
          if (iVar5 != 0) {
            psVar10 = (string *)__cxa_allocate_exception(0x20);
            *(string **)psVar10 = psVar10 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>(psVar10,"ERROE_WRONG_PACK_CODE","");
            __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          iVar5 = (ppVar8->second).second;
          pbVar9 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&str2tile_abi_cxx11_,&(ppVar8->second).first);
          uVar11 = 0x100;
        }
      }
      local_148.hand_tiles.fixed_packs[uVar12] = uVar11 | (ushort)(iVar5 << 0xc) | (ushort)*pbVar9;
      ppVar8 = (pack->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(pack->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar8 >> 3) *
               -0x71c71c71c71c71c7;
      bVar18 = uVar14 <= uVar12;
      lVar15 = uVar12 - uVar14;
      uVar12 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar18 && lVar15 != 0);
  }
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&str2tile_abi_cxx11_,local_150);
  uVar4 = local_148._48_8_;
  local_148.flower_count = (uint8_t)local_158;
  local_148.win_tile = *pmVar7;
  uVar3 = local_148._48_2_;
  if ((char)local_154 != '\0') {
    local_148.win_flag = SUB81(uVar4,2);
    local_148._51_5_ = SUB85(uVar4,3);
    local_148._48_4_ = (uint)CONCAT53(local_148._51_5_,CONCAT12(local_148.win_flag,uVar3)) | 0x10000
    ;
  }
  if (isLAST) {
    local_148._48_4_ = local_148._48_4_ | 0x80000;
  }
  if (isJUEZHANG) {
    local_148._48_4_ = local_148._48_4_ | 0x20000;
  }
  if (isGANG) {
    local_148._48_4_ = local_148._48_4_ | 0x40000;
  }
  local_148.prevalent_wind = quanFeng;
  local_148.seat_wind = menFeng;
  iVar5 = mahjong::calculate_fan(&local_148,(fan_table_t *)local_d8);
  if (iVar5 == -3) {
    psVar10 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar10 = psVar10 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar10,"ERROR_NOT_WIN","");
    __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (iVar5 == -2) {
    psVar10 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar10 = psVar10 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar10,"ERROR_TILE_COUNT_GREATER_THAN_4","");
    __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (iVar5 != -1) {
    lVar15 = 0;
    piVar17 = &_ZN7mahjongL8fan_nameE_rel;
    do {
      if (*(ushort *)((long)local_d8 + lVar15) != 0) {
        local_100._0_4_ =
             (uint)*(ushort *)((long)&mahjong::fan_value_table + lVar15) *
             (uint)*(ushort *)((long)local_d8 + lVar15);
        std::__cxx11::string::string
                  ((string *)&local_f8,(char *)((long)&_ZN7mahjongL8fan_nameE_rel + (long)*piVar17),
                   &local_161);
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<std::pair<int,std::__cxx11::string>>
                  (local_160,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p != &local_e8) {
          operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
        }
      }
      piVar17 = piVar17 + 1;
      lVar15 = lVar15 + 2;
    } while (lVar15 != 0xa6);
    return (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_160;
  }
  psVar10 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar10 = psVar10 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar10,"ERROR_WRONG_TILES_COUNT","");
  __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

vector<pair<int, string> > MahjongFanCalculator(
    vector<pair<string, pair<string, int> > > pack,
    vector<string> hand,
    string winTile,
    int flowerCount,
    bool isZIMO,
    bool isJUEZHANG,
    bool isGANG,
    bool isLAST,
    int menFeng,
    int quanFeng)
{
    vector<pair<int,string>> ans;
    mahjong::calculate_param_t calculate_param;
    mahjong::fan_table_t fan_table;
    memset(&calculate_param, 0, sizeof(mahjong::calculate_param_t));
    memset(&fan_table, 0, sizeof(mahjong::fan_table_t));
    calculate_param.hand_tiles.tile_count = hand.size();
    for(unsigned int i = 0; i < hand.size(); i++) {
        if(str2tile.find(hand[i]) == str2tile.end()){
            throw string("ERROE_WRONG_TILE_CODE");
        }
        calculate_param.hand_tiles.standing_tiles[i] = str2tile[hand[i]];
    }
    calculate_param.hand_tiles.pack_count = pack.size();
    for(unsigned int i = 0; i < pack.size(); i++) {
        pair<string, pair<string, int>> &sPack = pack[i];
        mahjong::pack_t &dPack = calculate_param.hand_tiles.fixed_packs[i];
        if(sPack.first == "PENG") {
            dPack = mahjong::make_pack(sPack.second.second, PACK_TYPE_PUNG, str2tile[sPack.second.first]);
        } else if(sPack.first == "GANG") {
            dPack = mahjong::make_pack(sPack.second.second, PACK_TYPE_KONG, str2tile[sPack.second.first]);
        } else if(sPack.first == "CHI"){
            dPack = mahjong::make_pack(sPack.second.second, PACK_TYPE_CHOW, str2tile[sPack.second.first]);
        } else {
            throw string("ERROE_WRONG_PACK_CODE");
        }
    }
    calculate_param.win_tile = str2tile[winTile];
    calculate_param.flower_count = flowerCount;
    if(isZIMO) {
        calculate_param.win_flag |= WIN_FLAG_SELF_DRAWN;
    }
    if(isLAST) {
        calculate_param.win_flag |= WIN_FLAG_WALL_LAST;
    }
    if(isJUEZHANG) {
        calculate_param.win_flag |= WIN_FLAG_4TH_TILE;
    }
    if(isGANG) {
        calculate_param.win_flag |= WIN_FLAG_ABOUT_KONG;
    }
    calculate_param.prevalent_wind = (mahjong::wind_t)quanFeng;
    calculate_param.seat_wind = (mahjong::wind_t)menFeng;
    int re = mahjong::calculate_fan(&calculate_param, &fan_table);
    if(re == -1) {
        throw string("ERROR_WRONG_TILES_COUNT");
    }else if(re == -2) {
        throw string("ERROR_TILE_COUNT_GREATER_THAN_4");
    }else if(re == -3) {
        throw string("ERROR_NOT_WIN");
    }
    for(int i = 0; i < mahjong::FAN_TABLE_SIZE; i++) {
        if(fan_table[i] > 0) {
            ans.push_back(make_pair(fan_table[i]*mahjong::fan_value_table[i],mahjong::fan_name[i]));
        }
    }
    return ans;
}